

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::tryCastToType
          (Value *__return_storage_ptr__,Value *this,Type *destType,CompileMessage *errorMessage)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_150;
  string local_130;
  CompileMessage local_110;
  string local_d8;
  string local_b8;
  string local_98;
  CompileMessage local_78;
  undefined1 local_29;
  CompileMessage *local_28;
  CompileMessage *errorMessage_local;
  Type *destType_local;
  Value *this_local;
  Value *result;
  
  local_29 = 0;
  local_28 = errorMessage;
  errorMessage_local = (CompileMessage *)destType;
  destType_local = &this->type;
  this_local = __return_storage_ptr__;
  tryCastToType(__return_storage_ptr__,this,destType);
  bVar1 = isValid(__return_storage_ptr__);
  if (!bVar1) {
    bVar1 = Type::isPrimitive(&this->type);
    if (bVar1) {
      getDescription_abi_cxx11_(&local_98,this,(StringDictionary *)0x0);
      Type::getDescription_abi_cxx11_(&local_b8,&this->type);
      Type::getDescription_abi_cxx11_(&local_d8,(Type *)errorMessage_local);
      Errors::cannotCastValue<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_78,(Errors *)&local_98,&local_b8,&local_d8,in_R8);
      CompileMessage::operator=(local_28,&local_78);
      CompileMessage::~CompileMessage(&local_78);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      Type::getDescription_abi_cxx11_(&local_130,&this->type);
      Type::getDescription_abi_cxx11_(&local_150,(Type *)errorMessage_local);
      Errors::cannotCastBetween<std::__cxx11::string,std::__cxx11::string>
                (&local_110,(Errors *)&local_130,&local_150,&errorMessage->description);
      CompileMessage::operator=(local_28,&local_110);
      CompileMessage::~CompileMessage(&local_110);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::tryCastToType (const Type& destType, CompileMessage& errorMessage) const
{
    auto result = tryCastToType (destType);

    if (! result.isValid())
    {
        if (type.isPrimitive())
            errorMessage = Errors::cannotCastValue (getDescription(), type.getDescription(), destType.getDescription());
        else
            errorMessage = Errors::cannotCastBetween (type.getDescription(), destType.getDescription());
    }

    return result;
}